

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::JunitReporter::testCaseEnded(JunitReporter *this,TestCaseStats *testCaseStats)

{
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&this->stdOutForSuite,(testCaseStats->stdOut)._M_dataplus._M_p,
             (testCaseStats->stdOut)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&this->stdErrForSuite,(testCaseStats->stdErr)._M_dataplus._M_p,
             (testCaseStats->stdErr)._M_string_length);
  CumulativeReporterBase::testCaseEnded(&this->super_CumulativeReporterBase,testCaseStats);
  return;
}

Assistant:

virtual void testCaseEnded( TestCaseStats const& testCaseStats ) {
            stdOutForSuite << testCaseStats.stdOut;
            stdErrForSuite << testCaseStats.stdErr;
            CumulativeReporterBase::testCaseEnded( testCaseStats );
        }